

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

Atom writeTargetToProperty(XSelectionRequestEvent *request)

{
  Window WVar1;
  Atom AVar2;
  Atom AVar3;
  Display *pDVar4;
  PFN_XChangeProperty p_Var5;
  Atom AVar6;
  unsigned_long uVar7;
  size_t sVar8;
  int local_84;
  int j;
  unsigned_long count;
  unsigned_long i_1;
  Atom *targets_1;
  Atom targets [4];
  Atom AStack_38;
  int formatCount;
  Atom formats [2];
  char *selectionString;
  int i;
  XSelectionRequestEvent *request_local;
  
  p_Var5 = _glfw.x11.xlib.ChangeProperty;
  pDVar4 = _glfw.x11.display;
  AStack_38 = _glfw.x11.UTF8_STRING;
  formats[0] = 0x1f;
  if (request->selection == _glfw.x11.PRIMARY) {
    formats[1] = (Atom)_glfw.x11.primarySelectionString;
  }
  else {
    formats[1] = (Atom)_glfw.x11.clipboardString;
  }
  AVar6 = formats[1];
  if (request->property == 0) {
    request_local = (XSelectionRequestEvent *)0x0;
  }
  else if (request->target == _glfw.x11.TARGETS) {
    targets_1 = (Atom *)_glfw.x11.TARGETS;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = 0x1f;
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,request->requestor,request->property,4,0x20,0,(uchar *)&targets_1,4
              );
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else if (request->target == _glfw.x11.MULTIPLE) {
    uVar7 = _glfwGetWindowPropertyX11
                      (request->requestor,request->property,_glfw.x11.ATOM_PAIR,(uchar **)&i_1);
    for (count = 0; AVar6 = formats[1], p_Var5 = _glfw.x11.xlib.ChangeProperty,
        pDVar4 = _glfw.x11.display, count < uVar7; count = count + 2) {
      local_84 = 0;
      while ((local_84 < 2 &&
             (*(long *)(i_1 + count * 8) !=
              *(long *)((long)&stack0xffffffffffffffc8 + (long)local_84 * 8)))) {
        local_84 = local_84 + 1;
      }
      if (local_84 < 2) {
        WVar1 = request->requestor;
        AVar2 = *(Atom *)(i_1 + 8 + count * 8);
        AVar3 = *(Atom *)(i_1 + count * 8);
        sVar8 = strlen((char *)formats[1]);
        (*p_Var5)(pDVar4,WVar1,AVar2,AVar3,8,0,(uchar *)AVar6,(int)sVar8);
      }
      else {
        *(undefined8 *)(i_1 + 8 + count * 8) = 0;
      }
    }
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,request->requestor,request->property,_glfw.x11.ATOM_PAIR,0x20,0,
               (uchar *)i_1,(int)uVar7);
    (*_glfw.x11.xlib.Free)((void *)i_1);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else if (request->target == _glfw.x11.SAVE_TARGETS) {
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,request->requestor,request->property,_glfw.x11.NULL_,0x20,0,
               (uchar *)0x0,0);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else {
    for (selectionString._4_4_ = 0; selectionString._4_4_ < 2;
        selectionString._4_4_ = selectionString._4_4_ + 1) {
      if (request->target ==
          *(Atom *)((long)&stack0xffffffffffffffc8 + (long)selectionString._4_4_ * 8)) {
        WVar1 = request->requestor;
        AVar2 = request->property;
        AVar3 = request->target;
        sVar8 = strlen((char *)formats[1]);
        (*p_Var5)(pDVar4,WVar1,AVar2,AVar3,8,0,(uchar *)AVar6,(int)sVar8);
        return request->property;
      }
    }
    request_local = (XSelectionRequestEvent *)0x0;
  }
  return (Atom)request_local;
}

Assistant:

static Atom writeTargetToProperty(const XSelectionRequestEvent* request)
{
    int i;
    char* selectionString = NULL;
    const Atom formats[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const int formatCount = sizeof(formats) / sizeof(formats[0]);

    if (request->selection == _glfw.x11.PRIMARY)
        selectionString = _glfw.x11.primarySelectionString;
    else
        selectionString = _glfw.x11.clipboardString;

    if (request->property == None)
    {
        // The requester is a legacy client (ICCCM section 2.2)
        // We don't support legacy clients, so fail here
        return None;
    }

    if (request->target == _glfw.x11.TARGETS)
    {
        // The list of supported targets was requested

        const Atom targets[] = { _glfw.x11.TARGETS,
                                 _glfw.x11.MULTIPLE,
                                 _glfw.x11.UTF8_STRING,
                                 XA_STRING };

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        sizeof(targets) / sizeof(targets[0]));

        return request->property;
    }

    if (request->target == _glfw.x11.MULTIPLE)
    {
        // Multiple conversions were requested

        Atom* targets;
        unsigned long i, count;

        count = _glfwGetWindowPropertyX11(request->requestor,
                                          request->property,
                                          _glfw.x11.ATOM_PAIR,
                                          (unsigned char**) &targets);

        for (i = 0;  i < count;  i += 2)
        {
            int j;

            for (j = 0;  j < formatCount;  j++)
            {
                if (targets[i] == formats[j])
                    break;
            }

            if (j < formatCount)
            {
                XChangeProperty(_glfw.x11.display,
                                request->requestor,
                                targets[i + 1],
                                targets[i],
                                8,
                                PropModeReplace,
                                (unsigned char *) selectionString,
                                strlen(selectionString));
            }
            else
                targets[i + 1] = None;
        }

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.ATOM_PAIR,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        count);

        XFree(targets);

        return request->property;
    }

    if (request->target == _glfw.x11.SAVE_TARGETS)
    {
        // The request is a check whether we support SAVE_TARGETS
        // It should be handled as a no-op side effect target

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.NULL_,
                        32,
                        PropModeReplace,
                        NULL,
                        0);

        return request->property;
    }

    // Conversion to a data target was requested

    for (i = 0;  i < formatCount;  i++)
    {
        if (request->target == formats[i])
        {
            // The requested target is one we support

            XChangeProperty(_glfw.x11.display,
                            request->requestor,
                            request->property,
                            request->target,
                            8,
                            PropModeReplace,
                            (unsigned char *) selectionString,
                            strlen(selectionString));

            return request->property;
        }
    }

    // The requested target is not supported

    return None;
}